

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleAbstractScrollArea::childAt(QAccessibleAbstractScrollArea *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  QPoint QVar4;
  QSize QVar5;
  QAccessibleInterface *pQVar6;
  int i;
  ulong uVar7;
  long in_FS_OFFSET;
  QPoint local_68;
  undefined8 uStack_60;
  QArrayDataPointer<QWidget_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  if ((*(byte *)(*(long *)(lVar3 + 0x20) + 9) & 0x80) != 0) {
    uVar7 = 0;
    while( true ) {
      iVar2 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))(this);
      if ((long)iVar2 <= (long)uVar7) break;
      accessibleChildren((QWidgetList *)&local_50,this);
      local_68.xp.m_i = 0;
      local_68.yp.m_i = 0;
      QVar4 = QWidget::mapToGlobal(local_50.ptr[uVar7],&local_68);
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_50);
      local_68 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      accessibleChildren((QWidgetList *)&local_50,this);
      QVar5 = QWidget::size(local_50.ptr[uVar7]);
      uStack_60._4_4_ = QVar5.ht.m_i.m_i + QVar4.yp.m_i.m_i + -1;
      uStack_60._0_4_ = QVar4.xp.m_i.m_i + QVar5.wd.m_i.m_i + -1;
      local_68 = QVar4;
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_50);
      bVar1 = QRect::contains((QRect *)&local_68,x,y);
      if (bVar1) {
        pQVar6 = (QAccessibleInterface *)
                 (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x48))
                           (this,uVar7 & 0xffffffff);
        goto LAB_004cc039;
      }
      uVar7 = uVar7 + 1;
    }
  }
  pQVar6 = (QAccessibleInterface *)0x0;
LAB_004cc039:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractScrollArea::childAt(int x, int y) const
{
    if (!abstractScrollArea()->isVisible())
        return nullptr;

    for (int i = 0; i < childCount(); ++i) {
        QPoint wpos = accessibleChildren().at(i)->mapToGlobal(QPoint(0, 0));
        QRect rect = QRect(wpos, accessibleChildren().at(i)->size());
        if (rect.contains(x, y))
            return child(i);
    }
    return nullptr;
}